

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ctsa.c
# Opt level: O3

myarima_object
search_arima(double *x,int N,int d,int D,int p_max,int q_max,int P_max,int Q_max,int Order_max,
            int stationary,int s,char *ic,int approximation,double *xreg,int r,double offset,
            int allowdrift,int allowmean,int verbose,int method)

{
  sarimax_object psVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  uint uVar5;
  myarima_object pmVar6;
  undefined4 in_register_0000000c;
  undefined8 uVar7;
  byte bVar8;
  int iVar9;
  bool bVar10;
  double dVar11;
  undefined8 in_stack_fffffffffffffee8;
  undefined8 uStack_e8;
  int bestseasonal [4];
  double local_d0;
  double local_b8;
  undefined8 local_b0;
  int bestorder [3];
  uint local_88;
  undefined4 uStack_84;
  int iStack_80;
  int iStack_7c;
  undefined8 local_70;
  int order [3];
  
  register0x00000008 = CONCAT44(in_register_0000000c,D);
  register0x00000080 = (ulong)(uint)d;
  order[0] = 0;
  local_70 = 0;
  local_88 = 0;
  uStack_84 = 0;
  iStack_80 = 0;
  iStack_7c = 0;
  bestorder[0] = 0;
  local_b0 = 0;
  uStack_e8 = 0;
  bestseasonal[0] = 0;
  bestseasonal[1] = 0;
  local_b8 = 1.79769313486232e+308;
  iVar4 = 0;
  do {
    if (-1 < q_max) {
      iVar3 = 0;
      do {
        if (-1 < P_max) {
          uVar5 = 0;
          do {
            if (-1 < Q_max) {
              bestorder[1] = uVar5 | order[2];
              iVar9 = 0;
              do {
                if ((int)(iVar4 + iVar3 + uVar5 + iVar9) <= Order_max) {
                  bVar10 = bestorder[1] == 0;
                  uVar7 = 0;
                  bVar8 = 1;
                  do {
                    local_70 = CONCAT44((int)stack0xffffffffffffff60,iVar4);
                    if (bVar10 && iVar9 == 0 || s == 0) {
                      iStack_7c = 0;
                      uStack_84 = 0;
                      iStack_80 = 0;
                      local_88 = 0;
                    }
                    else {
                      uStack_84 = (undefined4)stack0xffffffffffffffa0;
                      iStack_7c = s;
                      local_88 = uVar5;
                      iStack_80 = iVar9;
                    }
                    order[0] = iVar3;
                    pmVar6 = myarima(x,N,(int *)&local_70,(int *)&local_88,(int)uVar7,ic,
                                     (int)in_stack_fffffffffffffee8,approximation,offset,xreg,r,
                                     (int *)0x0);
                    if (verbose == 1) {
                      psVar1 = pmVar6->sarimax;
                      bestseasonal._8_8_ = pmVar6->ic;
                      printf("p: %d d: %d q: %d P: %d D: %d Q: %d Drift/Mean: %d ic: %g \n",
                             (ulong)(uint)psVar1->p,stack0xffffffffffffff60,(ulong)(uint)psVar1->q,
                             (ulong)(uint)psVar1->P,stack0xffffffffffffffa0,(ulong)(uint)psVar1->Q,
                             uVar7);
                      dVar11 = (double)bestseasonal._8_8_;
                    }
                    else {
                      dVar11 = pmVar6->ic;
                    }
                    if (dVar11 < local_b8) {
                      bestorder[0] = order[0];
                      local_b0 = local_70;
                      uStack_e8 = CONCAT44(uStack_84,local_88);
                      bestseasonal[1] = iStack_7c;
                      bestseasonal[0] = iStack_80;
                      local_d0 = (double)(int)uVar7;
                      local_b8 = dVar11;
                    }
                    free(pmVar6->sarimax);
                    free(pmVar6);
                    uVar7 = 1;
                    bVar2 = (bool)((D + d == 0 && allowmean != 0 || D + d == 1 && allowdrift != 0) &
                                  bVar8);
                    bVar8 = 0;
                  } while (bVar2);
                }
                bVar10 = iVar9 != Q_max;
                iVar9 = iVar9 + 1;
              } while (bVar10);
            }
            bVar10 = uVar5 != P_max;
            uVar5 = uVar5 + 1;
          } while (bVar10);
        }
        bVar10 = iVar3 != q_max;
        iVar3 = iVar3 + 1;
      } while (bVar10);
    }
    bVar10 = iVar4 != p_max;
    iVar4 = iVar4 + 1;
  } while (bVar10);
  pmVar6 = myarima(x,N,(int *)&local_b0,(int *)&uStack_e8,(int)local_d0,ic,
                   (int)in_stack_fffffffffffffee8,approximation,offset,xreg,r,(int *)0x0);
  if (((approximation != 0) && (pmVar6->ic == 1.79769313486232e+308)) && (!NAN(pmVar6->ic))) {
    free(pmVar6->sarimax);
    free(pmVar6);
    pmVar6 = search_arima(x,N,(int)stack0xffffffffffffff60,(int)stack0xffffffffffffffa0,p_max,q_max,
                          P_max,Q_max,Order_max,stationary,s,ic,0,xreg,r,offset,allowdrift,allowmean
                          ,verbose,method);
  }
  return pmVar6;
}

Assistant:

myarima_object search_arima(double *x, int N,int d, int D, int p_max, int q_max, int P_max, int Q_max, int Order_max, int stationary,int s, const char *ic,
	int approximation, double *xreg, int r, double offset,int allowdrift, int allowmean,int verbose, int method) {

	int idrift, imean, maxK, i, j, I, J,K;
	double best_ic,bestK,iapprox;
	myarima_object bestfit;
	myarima_object fit;
	int order[3] = {0,0,0};
	int seasonal[4] = {0,0,0,0};
	int bestorder[3] = {0,0,0};
	int bestseasonal[4] = {0,0,0,0};
	int trace = 0;

	
	idrift = allowdrift && (d + D == 1);

	imean = allowmean && (d + D == 0);

	maxK = (idrift || imean);

	//serial implementation

	//printf("d %d D %d p_max %d q_max %d P_max %d Q_max %d maxK %d \n",d,D,p_max,q_max,P_max,Q_max,maxK);

	best_ic = DBL_MAX;

	for(i = 0; i <= p_max; ++i) {
		for(j = 0;j <= q_max;++j) {
			for(I = 0; I <= P_max;++I) {
				for(J = 0; J <= Q_max; ++J) {
					if (i+j+I+J <= Order_max) {
						for(K = 0; K <= maxK; ++K) {
							order[0] = i;
							order[1] = d;
							order[2] = j;
							
							// bug fix: still need to set PDQ or else carries over
							// prior PDQ parameters in seasonal which may be non 0 but then attempt
							// to optimize model with > 0 PDQ which can throw seg faults
							// for example in emle.fcssx when mutating phi which assumes s is > 0 if P+Q is > 0
							if (
								s == 0 ||
								(I == 0 && J == 0 && D == 0)
							) {
								seasonal[0] = seasonal[1] = seasonal[2] = seasonal[3] = 0;
							} else {
								seasonal[0] = I;
								seasonal[1] = D;
								seasonal[2] = J;
								seasonal[3] = s;
							}

							fit = myarima(x,N,order,seasonal, K, ic, trace, approximation, offset,xreg, r, NULL);
							if (verbose == 1) {
								printf("p: %d d: %d q: %d P: %d D: %d Q: %d Drift/Mean: %d ic: %g \n",fit->sarimax->p,d,fit->sarimax->q,fit->sarimax->P,D,fit->sarimax->Q,K,fit->ic);
							}
							
							//myarima_summary(fit);

							if (best_ic > fit->ic) {
								best_ic = fit->ic;
								memcpy(bestorder,order,sizeof(int)*3);
								memcpy(bestseasonal,seasonal,sizeof(int)*4);
								bestK = K;
							}

							myarima_free(fit);

						}
					}
				}
			}
		}
	}

	//printf("best_ic %g \n",best_ic);

	bestfit = myarima(x,N,bestorder,bestseasonal, bestK, ic, trace, approximation, offset,xreg, r, NULL);

	if (approximation) {
		if (bestfit->ic == DBL_MAX) {
			iapprox = 0;
			myarima_free(bestfit);

			bestfit = search_arima(x,N,d,D,p_max,q_max,P_max,Q_max,Order_max,stationary,s,ic,iapprox,xreg,r,offset,allowdrift,allowmean,verbose,method);

		}
	}


	return bestfit;
}